

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

void print<mpt::array>(void)

{
  uint uVar1;
  ostream *poVar2;
  long *plVar3;
  uint uVar4;
  char local_3c [8];
  int local_34;
  
  uVar1 = mpt::type_properties<mpt::span<const_mpt::array>_>::id(true);
  local_34 = mpt::type_properties<mpt::span<mpt::array>_>::id(true);
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = uVar1;
    if (0xff < uVar1) {
      if (uVar1 == 0x801) {
        uVar4 = 0x80;
      }
      else {
        uVar4 = 0xb;
        if (uVar1 != 0x802) {
          uVar4 = (uint)(uVar1 < 0x800) << 7;
        }
      }
    }
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x802);
  local_3c[0] = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c,1);
  local_3c[1] = 0x3c;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 1,1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xb);
  local_3c[2] = 0x3e;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 2,1);
  local_3c[3] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 3,1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
  local_3c[4] = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 4,1);
  local_3c[5] = 0x3c;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 5,1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,uVar4);
  local_3c[6] = 0x3e;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 6,1);
  local_3c[7] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 7,1);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_34);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void print()
{
	int id = mpt::type_properties<T>::id(true);
	int sid = mpt::type_properties<mpt::span<const T> >::id(true);
	int mid = mpt::type_properties<mpt::span<T> >::id(true);
	int bid = mpt::basetype(id);
	int bsid = mpt::basetype(sid);
	std::cout << id  << ' ' << '<' << bid  << '>' << ' ';
	std::cout << sid << ' ' << '<' << bsid << '>' << ' ';
	std::cout << mid << std::endl;
}